

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O2

void __thiscall
cppcms::url_dispatcher::binder4<disp>::operator()
          (binder4<disp> *this,string *p1,string *p2,string *p3,string *p4)

{
  code *pcVar1;
  application *paVar2;
  page_guard<disp,_void> guard;
  page_guard<disp,_void> local_c0;
  string *local_b8;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  local_c0.object_ = &this->object->super_application;
  local_b8 = p4;
  (**(code **)(*(long *)local_c0.object_ + 0x18))();
  pcVar1 = (code *)this->member;
  paVar2 = &this->object->super_application + *(long *)&this->field_0x8;
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)paVar2 + -1);
  }
  std::__cxx11::string::string(local_50,(string *)p1);
  std::__cxx11::string::string(local_70,(string *)p2);
  std::__cxx11::string::string(local_90,(string *)p3);
  std::__cxx11::string::string(local_b0,(string *)local_b8);
  (*pcVar1)(paVar2,local_50,local_70,local_90,local_b0);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  page_guard<disp,_void>::~page_guard(&local_c0);
  return;
}

Assistant:

void operator()(std::string p1,std::string p2,std::string p3,std::string p4) const
			{
				page_guard<C> guard(object);
				(object->*member)(p1,p2,p3,p4);
			}